

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O0

cell * references::scheme::proc_less(cell *__return_storage_ptr__,cells *c)

{
  cellit cVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
  local_38;
  __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
  local_30;
  __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
  local_28;
  cellit i;
  long n;
  cells *c_local;
  
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::operator[](c,0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  i._M_current = (cell *)atol(pcVar3);
  local_30._M_current =
       (cell *)std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::
               begin(c);
  local_28 = __gnu_cxx::
             __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
             ::operator+(&local_30,1);
  while( true ) {
    local_38._M_current =
         (cell *)std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::
                 end(c);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_38);
    cVar1 = i;
    if (!bVar2) {
      cell::cell(__return_storage_ptr__,(cell *)true_sym);
      return __return_storage_ptr__;
    }
    __gnu_cxx::
    __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
    ::operator->(&local_28);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    lVar4 = atol(pcVar3);
    if (lVar4 <= (long)cVar1._M_current) break;
    __gnu_cxx::
    __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
    ::operator++(&local_28);
  }
  cell::cell(__return_storage_ptr__,(cell *)false_sym);
  return __return_storage_ptr__;
}

Assistant:

cell proc_less(const cells & c)
{
	long n(atol(c[0].val.c_str()));
	for (cellit i = c.begin() + 1; i != c.end(); ++i)
		if (n >= atol(i->val.c_str()))
			return false_sym;
	return true_sym;
}